

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-example.cc
# Opt level: O3

string * __thiscall
ExprPrinter::format<double>
          (string *__return_storage_ptr__,ExprPrinter *this,char *format_str,double *args)

{
  int iVar1;
  pointer __src;
  size_t __n;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  ptrdiff_t _Num;
  char *str;
  double local_48 [3];
  
  iVar1 = this->next_expr_id_;
  this->next_expr_id_ = iVar1 + 1;
  local_48[0] = (double)CONCAT44(local_48[0]._4_4_,iVar1);
  fmt::format<int>(__return_storage_ptr__,(CStringRef)0x13a110,(int *)local_48);
  __src = (__return_storage_ptr__->_M_dataplus)._M_p;
  __n = __return_storage_ptr__->_M_string_length;
  pBVar2 = (this->output_).super_BasicWriter<char>.buffer_;
  uVar5 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,__src,__n);
  }
  pBVar2->size_ = uVar5;
  pBVar2 = (this->output_).super_BasicWriter<char>.buffer_;
  sVar4 = pBVar2->size_;
  uVar5 = sVar4 + 3;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
    sVar4 = pBVar2->size_;
  }
  pcVar3 = pBVar2->ptr_;
  pcVar3[sVar4 + 2] = ' ';
  pcVar3 = pcVar3 + sVar4;
  pcVar3[0] = ' ';
  pcVar3[1] = '=';
  pBVar2->size_ = uVar5;
  local_48[0] = *args;
  fmt::BasicWriter<char>::write
            (&(this->output_).super_BasicWriter<char>,(int)format_str,(void *)0x8,(size_t)local_48);
  pBVar2 = (this->output_).super_BasicWriter<char>.buffer_;
  sVar4 = pBVar2->size_;
  if (sVar4 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->size_ = sVar4 + 1;
  pBVar2->ptr_[sVar4] = '\n';
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char *format_str, const T &... args) {
    std::string id = fmt::format("e{}", next_expr_id_++);
    output_ << id << " = ";
    output_.write(format_str, args...);
    output_ << '\n';
    return id;
  }